

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_bmp(char *filename,int x,int y,int comp,void *data)

{
  int iVar1;
  int r;
  stbi__write_context s;
  void *in_stack_00000070;
  int in_stack_0000007c;
  int in_stack_00000080;
  int in_stack_00000084;
  stbi__write_context *in_stack_00000088;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  iVar1 = stbi__start_write_file
                    ((stbi__write_context *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = stbi_write_bmp_core(in_stack_00000088,in_stack_00000084,in_stack_00000080,
                                  in_stack_0000007c,in_stack_00000070);
    stbi__end_write_file((stbi__write_context *)0x1374c7);
  }
  return local_4;
}

Assistant:

STBIWDEF int stbi_write_bmp(char const *filename, int x, int y, int comp, const void *data)
{
   stbi__write_context s;
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_bmp_core(&s, x, y, comp, data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}